

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_lzhuf.cxx
# Opt level: O3

void __thiscall xray_re::_lzhuf::DeleteNode(_lzhuf *this,int p)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  int *piVar7;
  
  iVar4 = this->dad[p];
  if (iVar4 != 0x1000) {
    piVar1 = this->rson;
    iVar6 = this->rson[p];
    iVar2 = this->lson[p];
    iVar3 = iVar2;
    if ((iVar6 != 0x1000) && (iVar3 = iVar6, iVar2 != 0x1000)) {
      lVar5 = (long)iVar2;
      iVar4 = piVar1[lVar5];
      if (piVar1[lVar5] != 0x1000) {
        do {
          iVar2 = iVar4;
          lVar5 = (long)iVar2;
          iVar4 = piVar1[lVar5];
        } while (piVar1[lVar5] != 0x1000);
        iVar4 = this->lson[lVar5];
        this->rson[this->dad[lVar5]] = iVar4;
        this->dad[iVar4] = this->dad[lVar5];
        iVar4 = this->lson[p];
        this->lson[lVar5] = iVar4;
        this->dad[iVar4] = iVar2;
        iVar6 = this->rson[p];
      }
      this->rson[lVar5] = iVar6;
      this->dad[this->rson[p]] = iVar2;
      iVar4 = this->dad[p];
      iVar3 = iVar2;
    }
    this->dad[iVar3] = iVar4;
    piVar7 = this->lson;
    if (this->rson[this->dad[p]] == p) {
      piVar7 = piVar1;
    }
    piVar7[this->dad[p]] = iVar3;
    this->dad[p] = 0x1000;
  }
  return;
}

Assistant:

void _lzhuf::DeleteNode(int p)  /* remove from tree */
{
	int  q;

	if (dad[p] == NIL)
		return;			/* not registered */
	if (rson[p] == NIL)
		q = lson[p];
	else
	if (lson[p] == NIL)
		q = rson[p];
	else {
		q = lson[p];
		if (rson[q] != NIL) {
			do {
				q = rson[q];
			} while (rson[q] != NIL);
			rson[dad[q]] = lson[q];
			dad[lson[q]] = dad[q];
			lson[q] = lson[p];
			dad[lson[p]] = q;
		}
		rson[q] = rson[p];
		dad[rson[p]] = q;
	}
	dad[q] = dad[p];
	if (rson[dad[p]] == p)
		rson[dad[p]] = q;
	else
		lson[dad[p]] = q;
	dad[p] = NIL;
}